

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

string * __thiscall
symbols::RangeObject::toString_abi_cxx11_(string *__return_storage_ptr__,RangeObject *this)

{
  ostream *this_00;
  ostringstream out;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"range ",6);
  this_00 = (ostream *)std::ostream::operator<<((ostream *)local_190,this->init_value);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"..",2);
  std::ostream::operator<<((ostream *)this_00,this->end_value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string RangeObject::toString() const
{
    std::ostringstream out;
    out << "range " << init_value << ".." << end_value;
    return out.str();
}